

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMesh.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChMesh::IntStateGetIncrement
          (ChMesh *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  element_type *peVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  pointer psVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  
  psVar6 = (this->vnodes).
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->vnodes).
      super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar6) {
    iVar5 = 0;
    iVar7 = 0;
    uVar8 = 0;
    uVar9 = 1;
    do {
      iVar4 = (*(psVar6[uVar8].
                 super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                ->_vptr_ChNodeFEAbase[3])();
      if ((char)iVar4 == '\0') {
        peVar1 = (this->vnodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8].
                 super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        lVar2 = *(long *)((long)peVar1->_vptr_ChNodeFEAbase + -0x18);
        (**(code **)(*(long *)((long)&peVar1->_vptr_ChNodeFEAbase + lVar2) + 0x48))
                  ((long)&peVar1->_vptr_ChNodeFEAbase + lVar2,iVar7 + off_x,x_new,x,iVar5 + off_v,Dv
                  );
        peVar1 = (this->vnodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8].
                 super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        lVar2 = *(long *)((long)peVar1->_vptr_ChNodeFEAbase + -0x18);
        iVar4 = (**(code **)(*(long *)((long)&peVar1->_vptr_ChNodeFEAbase + lVar2) + 0x10))
                          ((long)&peVar1->_vptr_ChNodeFEAbase + lVar2);
        iVar7 = iVar4 + iVar7;
        peVar1 = (this->vnodes).
                 super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar8].
                 super___shared_ptr<chrono::fea::ChNodeFEAbase,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        lVar2 = *(long *)((long)peVar1->_vptr_ChNodeFEAbase + -0x18);
        iVar4 = (**(code **)(*(long *)((long)&peVar1->_vptr_ChNodeFEAbase + lVar2) + 0x18))
                          ((long)&peVar1->_vptr_ChNodeFEAbase + lVar2);
        iVar5 = iVar4 + iVar5;
      }
      psVar6 = (this->vnodes).
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar3 = uVar9 < (ulong)((long)(this->vnodes).
                                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAbase>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAbase>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4);
      uVar8 = uVar9;
      uVar9 = (ulong)((int)uVar9 + 1);
    } while (bVar3);
  }
  return;
}

Assistant:

void ChMesh::IntStateGetIncrement(const unsigned int off_x,
                               const ChState& x_new,
                               const ChState& x,
                               const unsigned int off_v,
                               ChStateDelta& Dv) {
    unsigned int local_off_x = 0;
    unsigned int local_off_v = 0;
    for (unsigned int j = 0; j < vnodes.size(); j++) {
        if (!vnodes[j]->GetFixed()) {
            vnodes[j]->NodeIntStateGetIncrement(off_x + local_off_x, x_new, x, off_v + local_off_v, Dv);
            local_off_x += vnodes[j]->Get_ndof_x();
            local_off_v += vnodes[j]->Get_ndof_w();
        }
    }
}